

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

UBool __thiscall icu_63::DecimalFormat::operator==(DecimalFormat *this,Format *other)

{
  bool bVar1;
  UBool UVar2;
  long lVar3;
  
  bVar1 = false;
  lVar3 = __dynamic_cast(other,&Format::typeinfo,&typeinfo,0);
  if (lVar3 != 0) {
    bVar1 = icu_63::number::impl::DecimalFormatProperties::operator==
                      ((this->fields->properties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                       (DecimalFormatProperties *)**(undefined8 **)(lVar3 + 0x168));
    if (bVar1) {
      UVar2 = DecimalFormatSymbols::operator==
                        ((this->fields->symbols).
                         super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,
                         *(DecimalFormatSymbols **)(*(long *)(lVar3 + 0x168) + 8));
      bVar1 = UVar2 != '\0';
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

UBool DecimalFormat::operator==(const Format& other) const {
    auto* otherDF = dynamic_cast<const DecimalFormat*>(&other);
    if (otherDF == nullptr) {
        return false;
    }
    return *fields->properties == *otherDF->fields->properties && *fields->symbols == *otherDF->fields->symbols;
}